

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasClearRGB(float red,float green,float blue,Canvas *ptr)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  
  if (ptr != (Canvas *)0x0) {
    uVar3 = ptr->height * ptr->width;
    if (0 < (int)uVar3) {
      pcVar2 = (ptr->data).ptr;
      lVar4 = 0;
      do {
        *(float *)(pcVar2 + lVar4) = red / 255.0;
        *(float *)(pcVar2 + lVar4 + 4) = green / 255.0;
        *(float *)(pcVar2 + lVar4 + 8) = blue / 255.0;
        pcVar1 = pcVar2 + lVar4 + 0xc;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = -0x80;
        pcVar1[3] = '?';
        lVar4 = lVar4 + 0x10;
      } while ((ulong)uVar3 << 4 != lVar4);
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasClearRGB(float red, float green, float blue, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = 1.0f;
		}
	}